

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd2.c
# Opt level: O0

gdImagePtr gdImageCreateFromGd2(FILE *inFile)

{
  gdIOCtx *in_00;
  gdImagePtr im;
  gdIOCtx *in;
  FILE *inFile_local;
  
  in_00 = gdNewFileCtx(inFile);
  if (in_00 == (gdIOCtx *)0x0) {
    inFile_local = (FILE *)0x0;
  }
  else {
    inFile_local = (FILE *)gdImageCreateFromGd2Ctx(in_00);
    (*in_00->gd_free)(in_00);
  }
  return (gdImagePtr)inFile_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGd2 (FILE * inFile)
{
	gdIOCtx *in = gdNewFileCtx (inFile);
	gdImagePtr im;

	if (in == NULL) return NULL;
	im = gdImageCreateFromGd2Ctx (in);

	in->gd_free (in);

	return im;
}